

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# channel.c
# Opt level: O2

int libssh2_channel_forward_cancel(LIBSSH2_LISTENER *listener)

{
  LIBSSH2_SESSION *session;
  int iVar1;
  time_t start_time;
  
  if (listener == (LIBSSH2_LISTENER *)0x0) {
    iVar1 = -0x27;
  }
  else {
    start_time = time((time_t *)0x0);
    do {
      iVar1 = _libssh2_channel_forward_cancel(listener);
      if (iVar1 != -0x25) {
        return iVar1;
      }
      session = listener->session;
      if (session == (LIBSSH2_SESSION *)0x0) {
        return -0x25;
      }
      if (session->api_block_mode == 0) {
        return -0x25;
      }
      iVar1 = _libssh2_wait_socket(session,start_time);
    } while (iVar1 == 0);
  }
  return iVar1;
}

Assistant:

LIBSSH2_API int
libssh2_channel_forward_cancel(LIBSSH2_LISTENER *listener)
{
    int rc;

    if(!listener)
        return LIBSSH2_ERROR_BAD_USE;

    BLOCK_ADJUST(rc, listener->session,
                 _libssh2_channel_forward_cancel(listener));
    return rc;
}